

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

size_t ZopfliLZ77GetByteRange(ZopfliLZ77Store *lz77,size_t lstart,size_t lend)

{
  long lVar1;
  uint local_34;
  size_t l;
  size_t lend_local;
  size_t lstart_local;
  ZopfliLZ77Store *lz77_local;
  size_t local_8;
  
  lVar1 = lend - 1;
  if (lstart == lend) {
    local_8 = 0;
  }
  else {
    if (lz77->dists[lVar1] == 0) {
      local_34 = 1;
    }
    else {
      local_34 = (uint)lz77->litlens[lVar1];
    }
    local_8 = (lz77->pos[lVar1] + (long)(int)local_34) - lz77->pos[lstart];
  }
  return local_8;
}

Assistant:

size_t ZopfliLZ77GetByteRange(const ZopfliLZ77Store* lz77,
                              size_t lstart, size_t lend) {
  size_t l = lend - 1;
  if (lstart == lend) return 0;
  return lz77->pos[l] + ((lz77->dists[l] == 0) ?
      1 : lz77->litlens[l]) - lz77->pos[lstart];
}